

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

void __thiscall llvm::DWARFVerifier::verifyDebugLineStmtOffsets(DWARFVerifier *this)

{
  DWARFContext *this_00;
  LineTable *pLVar1;
  bool bVar2;
  int iVar3;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *puVar4;
  pointer pDVar5;
  unsigned_long *puVar6;
  LineTable *pLVar7;
  DWARFObject *pDVar8;
  undefined4 extraout_var;
  LineTable *pLVar9;
  raw_ostream *prVar10;
  pointer ppVar11;
  mapped_type *pmVar12;
  DWARFDie DVar13;
  Optional<unsigned_long> OVar14;
  uint64_t local_150;
  format_object<unsigned_long> local_148;
  uint64_t local_130;
  format_object<unsigned_long> local_128;
  _Self local_110;
  _Self local_108;
  iterator Iter;
  LineTable *LineTable;
  uint64_t LineTableOffset;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_a0;
  Optional<unsigned_long> StmtSectionOffset;
  DWARFDie Die;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *CU;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__end1;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__begin1;
  unit_iterator_range local_58;
  iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
  *local_48;
  unit_iterator_range *__range1;
  map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
  StmtListToDie;
  DWARFVerifier *this_local;
  
  StmtListToDie._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
  ::map((map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
         *)&__range1);
  local_58 = DWARFContext::compile_units(this->DCtx);
  local_48 = &local_58;
  __end1 = iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
           ::begin(local_48);
  puVar4 = iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
           ::end(local_48);
  do {
    if (__end1 == puVar4) {
      std::
      map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
      ::~map((map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
              *)&__range1);
      return;
    }
    pDVar5 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::operator->
                       (__end1);
    DVar13 = DWARFUnit::getUnitDIE(pDVar5,true);
    StmtSectionOffset.Storage._8_8_ = DVar13.U;
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)&LineTableOffset,
                   (DWARFDie *)&StmtSectionOffset.Storage.hasVal,DW_AT_stmt_list);
    OVar14 = dwarf::toSectionOffset((Optional<llvm::DWARFFormValue> *)&LineTableOffset);
    local_a0 = OVar14.Storage.field_0;
    StmtSectionOffset.Storage.field_0.empty = OVar14.Storage.hasVal;
    bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&local_a0.empty);
    if (bVar2) {
      puVar6 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_a0);
      LineTable = (LineTable *)*puVar6;
      this_00 = this->DCtx;
      pDVar5 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::get(__end1);
      pLVar7 = DWARFContext::getLineTableForUnit(this_00,pDVar5);
      pLVar1 = LineTable;
      pDVar8 = DWARFContext::getDWARFObj(this->DCtx);
      iVar3 = (*pDVar8->_vptr_DWARFObject[0xf])();
      pLVar9 = (LineTable *)StringRef::size((StringRef *)CONCAT44(extraout_var,iVar3));
      if (pLVar1 < pLVar9) {
        if (pLVar7 == (LineTable *)0x0) {
          this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
          prVar10 = error(this);
          prVar10 = raw_ostream::operator<<(prVar10,".debug_line[");
          format<unsigned_long>
                    ((format_object<unsigned_long> *)&Iter,"0x%08lx",(unsigned_long *)&LineTable);
          prVar10 = raw_ostream::operator<<(prVar10,(format_object_base *)&Iter);
          raw_ostream::operator<<(prVar10,"] was not able to be parsed for CU:\n");
          prVar10 = dump(this,(DWARFDie *)&StmtSectionOffset.Storage.hasVal,0);
          raw_ostream::operator<<(prVar10,'\n');
        }
        else {
          local_108._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
               ::find((map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                       *)&__range1,(key_type_conflict *)&LineTable);
          local_110._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
               ::end((map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                      *)&__range1);
          bVar2 = std::operator!=(&local_108,&local_110);
          if (bVar2) {
            this->NumDebugLineErrors = this->NumDebugLineErrors + 1;
            prVar10 = error(this);
            prVar10 = raw_ostream::operator<<(prVar10,"two compile unit DIEs, ");
            ppVar11 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>::
                      operator->(&local_108);
            local_130 = DWARFDie::getOffset(&ppVar11->second);
            format<unsigned_long>(&local_128,"0x%08lx",&local_130);
            prVar10 = raw_ostream::operator<<(prVar10,&local_128.super_format_object_base);
            prVar10 = raw_ostream::operator<<(prVar10," and ");
            local_150 = DWARFDie::getOffset((DWARFDie *)&StmtSectionOffset.Storage.hasVal);
            format<unsigned_long>(&local_148,"0x%08lx",&local_150);
            prVar10 = raw_ostream::operator<<(prVar10,&local_148.super_format_object_base);
            raw_ostream::operator<<(prVar10,", have the same DW_AT_stmt_list section offset:\n");
            ppVar11 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>::
                      operator->(&local_108);
            dump(this,&ppVar11->second,0);
            prVar10 = dump(this,(DWARFDie *)&StmtSectionOffset.Storage.hasVal,0);
            raw_ostream::operator<<(prVar10,'\n');
          }
          else {
            pmVar12 = std::
                      map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                      ::operator[]((map<unsigned_long,_llvm::DWARFDie,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDie>_>_>
                                    *)&__range1,(key_type_conflict *)&LineTable);
            pmVar12->U = (DWARFUnit *)StmtSectionOffset.Storage._8_8_;
            pmVar12->Die = DVar13.Die;
          }
        }
      }
      else if (pLVar7 != (LineTable *)0x0) {
        __assert_fail("LineTable == nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                      ,0x2a7,"void llvm::DWARFVerifier::verifyDebugLineStmtOffsets()");
      }
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

void DWARFVerifier::verifyDebugLineStmtOffsets() {
  std::map<uint64_t, DWARFDie> StmtListToDie;
  for (const auto &CU : DCtx.compile_units()) {
    auto Die = CU->getUnitDIE();
    // Get the attribute value as a section offset. No need to produce an
    // error here if the encoding isn't correct because we validate this in
    // the .debug_info verifier.
    auto StmtSectionOffset = toSectionOffset(Die.find(DW_AT_stmt_list));
    if (!StmtSectionOffset)
      continue;
    const uint64_t LineTableOffset = *StmtSectionOffset;
    auto LineTable = DCtx.getLineTableForUnit(CU.get());
    if (LineTableOffset < DCtx.getDWARFObj().getLineSection().Data.size()) {
      if (!LineTable) {
        ++NumDebugLineErrors;
        error() << ".debug_line[" << format("0x%08" PRIx64, LineTableOffset)
                << "] was not able to be parsed for CU:\n";
        dump(Die) << '\n';
        continue;
      }
    } else {
      // Make sure we don't get a valid line table back if the offset is wrong.
      assert(LineTable == nullptr);
      // Skip this line table as it isn't valid. No need to create an error
      // here because we validate this in the .debug_info verifier.
      continue;
    }
    auto Iter = StmtListToDie.find(LineTableOffset);
    if (Iter != StmtListToDie.end()) {
      ++NumDebugLineErrors;
      error() << "two compile unit DIEs, "
              << format("0x%08" PRIx64, Iter->second.getOffset()) << " and "
              << format("0x%08" PRIx64, Die.getOffset())
              << ", have the same DW_AT_stmt_list section offset:\n";
      dump(Iter->second);
      dump(Die) << '\n';
      // Already verified this line table before, no need to do it again.
      continue;
    }
    StmtListToDie[LineTableOffset] = Die;
  }
}